

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(defV *data,string *val)

{
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar1;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__str;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__str_00;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  helics *phVar3;
  uint *puVar4;
  undefined8 extraout_RDX;
  NamedPoint *point;
  vector<double,_std::allocator<double>_> *val_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_01;
  string *this;
  complex<double> val_02;
  string local_30;
  
  puVar4 = &switchD_002378a7::switchdataD_0039d608;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar1 = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::__cxx11::to_string(&local_30,*pvVar1);
    break;
  case '\x01':
    pvVar2 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    CLI::std::__cxx11::to_string((string *)&local_30,*pvVar2);
    break;
  default:
    __str_00 = std::
               get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         (data);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str_00);
    return;
  case '\x03':
    this = val;
    std::
    get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              (data);
    val_02._M_value._8_8_ = puVar4;
    val_02._M_value._0_8_ = extraout_RDX;
    helicsComplexString_abi_cxx11_(&local_30,(helics *)this,val_02);
    break;
  case '\x04':
    phVar3 = (helics *)
             std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    helicsVectorString_abi_cxx11_(&local_30,phVar3,val_00);
    break;
  case '\x05':
    phVar3 = (helics *)
             std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    helicsComplexVectorString_abi_cxx11_(&local_30,phVar3,val_01);
    break;
  case '\x06':
    __str = std::
            get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                      (data);
    if (NAN(__str->value)) {
      std::__cxx11::string::string
                ((string *)&local_30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    }
    else {
      helicsNamedPointString_abi_cxx11_(&local_30,(helics *)__str,point);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
    goto LAB_00237981;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
LAB_00237981:
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void valueExtract(const defV& data, std::string& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::to_string(std::get<double>(data));
            break;
        case int_loc:  // int64_t
            val = std::to_string(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        default:
            val = std::get<std::string>(data);
            break;
        case complex_loc:  // complex
            val = helicsComplexString(std::get<std::complex<double>>(data));
            break;
        case vector_loc:  // vector
            val = helicsVectorString(std::get<std::vector<double>>(data));
            break;
        case complex_vector_loc:  // vector
            val = helicsComplexVectorString(std::get<std::vector<std::complex<double>>>(data));
            break;
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            val = (std::isnan(point.value)) ? point.name : helicsNamedPointString(point);
            break;
        }
    }
}